

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteRestrictionManager.h
# Opt level: O0

void __thiscall
jaegertracing::baggage::RemoteRestrictionManager::~RemoteRestrictionManager
          (RemoteRestrictionManager *this)

{
  RemoteRestrictionManager *this_local;
  
  (this->super_RestrictionManager)._vptr_RestrictionManager =
       (_func_int **)&PTR__RemoteRestrictionManager_004fa800;
  (*(this->super_RestrictionManager)._vptr_RestrictionManager[3])();
  std::condition_variable::~condition_variable(&this->_cv);
  std::thread::~thread(&this->_thread);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::baggage::Restriction>_>_>
  ::~unordered_map(&this->_restrictions);
  std::__cxx11::string::~string((string *)&this->_serviceName);
  RestrictionManager::~RestrictionManager(&this->super_RestrictionManager);
  return;
}

Assistant:

~RemoteRestrictionManager() { close(); }